

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

void * ARKStepCreate(ARKRhsFn fe,ARKRhsFn fi,sunrealtype t0,N_Vector y0,SUNContext_conflict sunctx)

{
  undefined4 in_EAX;
  int iVar1;
  ARKodeMem pAVar2;
  undefined8 *puVar3;
  SUNNonlinearSolver NLS;
  int iVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  ARKodeMem ark_mem;
  ARKodeMem local_58;
  sunrealtype local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  auVar6._0_4_ = -(uint)((int)fe == 0);
  auVar6._4_4_ = -(uint)((int)((ulong)fe >> 0x20) == 0);
  auVar6._8_4_ = -(uint)((int)fi == 0);
  auVar6._12_4_ = -(uint)((int)((ulong)fi >> 0x20) == 0);
  iVar1 = movmskps(in_EAX,auVar6);
  if (iVar1 == 0xf) {
    pcVar5 = "Must specify at least one of fe, fi (both NULL).";
    iVar4 = -0x16;
    iVar1 = 0x36;
LAB_0012309a:
    arkProcessError((ARKodeMem)0x0,iVar4,iVar1,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,pcVar5);
    return (void *)0x0;
  }
  if (y0 == (N_Vector)0x0) {
    pcVar5 = "y0 = NULL illegal.";
    iVar4 = -0x16;
    iVar1 = 0x3e;
    goto LAB_0012309a;
  }
  if (sunctx == (SUNContext_conflict)0x0) {
    pcVar5 = "sunctx = NULL illegal.";
    iVar4 = -0x16;
    iVar1 = 0x45;
    goto LAB_0012309a;
  }
  local_50 = t0;
  local_48 = fe;
  uStack_40 = fi;
  pAVar2 = arkCreate(sunctx);
  if (pAVar2 == (ARKodeMem)0x0) {
    pcVar5 = "arkode_mem = NULL illegal.";
    iVar4 = -0x15;
    iVar1 = 0x4e;
    local_58 = (ARKodeMem)0x0;
    goto LAB_0012309a;
  }
  local_58 = pAVar2;
  puVar3 = (undefined8 *)calloc(1,0x200);
  if (puVar3 == (undefined8 *)0x0) {
    arkProcessError(pAVar2,-0x14,0x58,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Allocation of arkode_mem failed.");
LAB_001230e2:
    ARKodeFree(&local_58);
    return (void *)0x0;
  }
  pAVar2->step_attachlinsol = arkStep_AttachLinsol;
  pAVar2->step_attachmasssol = arkStep_AttachMasssol;
  pAVar2->step_disablelsetup = arkStep_DisableLSetup;
  pAVar2->step_disablemsetup = arkStep_DisableMSetup;
  pAVar2->step_getlinmem = arkStep_GetLmem;
  pAVar2->step_getmassmem = arkStep_GetMassMem;
  pAVar2->step_getimplicitrhs = arkStep_GetImplicitRHS;
  pAVar2->step_mmult = (ARKMassMultFn)0x0;
  pAVar2->step_getgammas = arkStep_GetGammas;
  pAVar2->step_init = arkStep_Init;
  pAVar2->step_fullrhs = arkStep_FullRHS;
  pAVar2->step = arkStep_TakeStep_Z;
  pAVar2->step_setuserdata = arkStep_SetUserData;
  pAVar2->step_printallstats = arkStep_PrintAllStats;
  pAVar2->step_writeparameters = arkStep_WriteParameters;
  pAVar2->step_resize = arkStep_Resize;
  pAVar2->step_free = arkStep_Free;
  pAVar2->step_printmem = arkStep_PrintMem;
  pAVar2->step_setdefaults = arkStep_SetDefaults;
  pAVar2->step_computestate = arkStep_ComputeState;
  pAVar2->step_setrelaxfn = arkStep_SetRelaxFn;
  pAVar2->step_setorder = arkStep_SetOrder;
  pAVar2->step_setnonlinearsolver = arkStep_SetNonlinearSolver;
  pAVar2->step_setlinear = arkStep_SetLinear;
  pAVar2->step_setnonlinear = arkStep_SetNonlinear;
  pAVar2->step_setautonomous = arkStep_SetAutonomous;
  pAVar2->step_setnlsrhsfn = arkStep_SetNlsRhsFn;
  pAVar2->step_setdeduceimplicitrhs = arkStep_SetDeduceImplicitRhs;
  pAVar2->step_setnonlincrdown = arkStep_SetNonlinCRDown;
  pAVar2->step_setnonlinrdiv = arkStep_SetNonlinRDiv;
  pAVar2->step_setdeltagammamax = arkStep_SetDeltaGammaMax;
  pAVar2->step_setlsetupfrequency = arkStep_SetLSetupFrequency;
  pAVar2->step_setpredictormethod = arkStep_SetPredictorMethod;
  pAVar2->step_setmaxnonliniters = arkStep_SetMaxNonlinIters;
  pAVar2->step_setnonlinconvcoef = arkStep_SetNonlinConvCoef;
  pAVar2->step_setstagepredictfn = arkStep_SetStagePredictFn;
  pAVar2->step_getnumrhsevals = arkStep_GetNumRhsEvals;
  pAVar2->step_getnumlinsolvsetups = arkStep_GetNumLinSolvSetups;
  pAVar2->step_getcurrentgamma = arkStep_GetCurrentGamma;
  pAVar2->step_getestlocalerrors = arkStep_GetEstLocalErrors;
  pAVar2->step_getnonlinearsystemdata = arkStep_GetNonlinearSystemData;
  pAVar2->step_getnumnonlinsolviters = arkStep_GetNumNonlinSolvIters;
  pAVar2->step_getnumnonlinsolvconvfails = arkStep_GetNumNonlinSolvConvFails;
  pAVar2->step_getnonlinsolvstats = arkStep_GetNonlinSolvStats;
  pAVar2->step_setforcing = arkStep_SetInnerForcing;
  pAVar2->step_supports_adaptive = 1;
  pAVar2->step_supports_implicit = 1;
  pAVar2->step_supports_massmatrix = 1;
  pAVar2->step_supports_relaxation = 1;
  pAVar2->step_mem = puVar3;
  iVar1 = arkStep_SetDefaults(pAVar2);
  pAVar2 = local_58;
  if (iVar1 != 0) {
    arkProcessError(local_58,iVar1,0x97,"ARKStepCreate",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Error setting default solver options");
    goto LAB_001230e2;
  }
  *(ulong *)((long)puVar3 + 0x1c) =
       ~(CONCAT44(-(uint)((int)uStack_40 == 0),-(uint)((int)local_48 == 0)) &
        CONCAT44(-(uint)(uStack_40._4_4_ == 0),-(uint)(local_48._4_4_ == 0))) & (ulong)DAT_00175580;
  iVar1 = arkAllocVec(local_58,y0,(N_Vector *)(puVar3 + 9));
  if (((iVar1 == 0) || (iVar1 = arkAllocVec(pAVar2,y0,(N_Vector *)(puVar3 + 10)), iVar1 == 0)) ||
     (iVar1 = arkAllocVec(pAVar2,y0,(N_Vector *)(puVar3 + 0xb)), iVar1 == 0)) goto LAB_001232f9;
  *puVar3 = fe;
  puVar3[1] = fi;
  pAVar2->lrw = pAVar2->lrw + 10;
  pAVar2->liw = pAVar2->liw + 0x29;
  *(undefined4 *)(puVar3 + 0x12) = 0;
  if (*(int *)(puVar3 + 4) == 0) {
LAB_0012320a:
    *(undefined1 (*) [16])(puVar3 + 0x26) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar3 + 0x24) = (undefined1  [16])0x0;
    puVar3[0x28] = 0;
    *(undefined4 *)(puVar3 + 0x29) = 0xffffffff;
    *(undefined1 (*) [16])(puVar3 + 0x2a) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar3 + 0x2c) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar3 + 0x2e) = (undefined1  [16])0x0;
    puVar3[0x30] = 0xffffffff00000000;
    puVar3[0x1d] = 0x3ff0000000000000;
    puVar3[0x20] = 0;
    puVar3[0x3c] = 0;
    *(undefined4 *)(puVar3 + 0x3d) = 0;
    puVar3[0x23] = 0;
    *(undefined1 (*) [16])(puVar3 + 0x31) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar3 + 0x33) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar3 + 0x35) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(puVar3 + 0x37) = (undefined1  [16])0x0;
    *(undefined4 *)(puVar3 + 0x39) = 0;
    iVar1 = arkInit(pAVar2,local_50,y0,0);
    if (iVar1 == 0) {
      return pAVar2;
    }
    pcVar5 = "Unable to initialize main ARKODE infrastructure";
    iVar4 = 0x104;
  }
  else {
    NLS = SUNNonlinSol_Newton(y0,pAVar2->sunctx);
    if (NLS == (SUNNonlinearSolver)0x0) {
      pcVar5 = "Error creating default Newton solver";
      iVar1 = -0x14;
      iVar4 = 0xc5;
    }
    else {
      iVar1 = ARKodeSetNonlinearSolver(pAVar2,NLS);
      if (iVar1 == 0) {
        *(undefined4 *)(puVar3 + 0x12) = 1;
        goto LAB_0012320a;
      }
      pcVar5 = "Error attaching default Newton solver";
      iVar1 = -0x14;
      iVar4 = 0xcd;
    }
  }
  arkProcessError(pAVar2,iVar1,iVar4,"ARKStepCreate",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep.c"
                  ,pcVar5);
LAB_001232f9:
  ARKodeFree(&local_58);
  return (void *)0x0;
}

Assistant:

void* ARKStepCreate(ARKRhsFn fe, ARKRhsFn fi, sunrealtype t0, N_Vector y0,
                    SUNContext sunctx)
{
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;
  SUNNonlinearSolver NLS;
  int retval;

  /* Check that at least one of fe, fi is supplied and is to be used */
  if (fe == NULL && fi == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_F);
    return (NULL);
  }

  /* Check for legal input parameters */
  if (y0 == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_Y0);
    return (NULL);
  }

  if (!sunctx)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return (NULL);
  }

  /* Create ark_mem structure and set default values */
  ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (NULL);
  }

  /* Allocate ARKodeARKStepMem structure, and initialize to zero */
  step_mem = NULL;
  step_mem = (ARKodeARKStepMem)malloc(sizeof(struct ARKodeARKStepMemRec));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  memset(step_mem, 0, sizeof(struct ARKodeARKStepMemRec));

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_attachlinsol              = arkStep_AttachLinsol;
  ark_mem->step_attachmasssol             = arkStep_AttachMasssol;
  ark_mem->step_disablelsetup             = arkStep_DisableLSetup;
  ark_mem->step_disablemsetup             = arkStep_DisableMSetup;
  ark_mem->step_getlinmem                 = arkStep_GetLmem;
  ark_mem->step_getmassmem                = arkStep_GetMassMem;
  ark_mem->step_getimplicitrhs            = arkStep_GetImplicitRHS;
  ark_mem->step_mmult                     = NULL;
  ark_mem->step_getgammas                 = arkStep_GetGammas;
  ark_mem->step_init                      = arkStep_Init;
  ark_mem->step_fullrhs                   = arkStep_FullRHS;
  ark_mem->step                           = arkStep_TakeStep_Z;
  ark_mem->step_setuserdata               = arkStep_SetUserData;
  ark_mem->step_printallstats             = arkStep_PrintAllStats;
  ark_mem->step_writeparameters           = arkStep_WriteParameters;
  ark_mem->step_resize                    = arkStep_Resize;
  ark_mem->step_free                      = arkStep_Free;
  ark_mem->step_printmem                  = arkStep_PrintMem;
  ark_mem->step_setdefaults               = arkStep_SetDefaults;
  ark_mem->step_computestate              = arkStep_ComputeState;
  ark_mem->step_setrelaxfn                = arkStep_SetRelaxFn;
  ark_mem->step_setorder                  = arkStep_SetOrder;
  ark_mem->step_setnonlinearsolver        = arkStep_SetNonlinearSolver;
  ark_mem->step_setlinear                 = arkStep_SetLinear;
  ark_mem->step_setnonlinear              = arkStep_SetNonlinear;
  ark_mem->step_setautonomous             = arkStep_SetAutonomous;
  ark_mem->step_setnlsrhsfn               = arkStep_SetNlsRhsFn;
  ark_mem->step_setdeduceimplicitrhs      = arkStep_SetDeduceImplicitRhs;
  ark_mem->step_setnonlincrdown           = arkStep_SetNonlinCRDown;
  ark_mem->step_setnonlinrdiv             = arkStep_SetNonlinRDiv;
  ark_mem->step_setdeltagammamax          = arkStep_SetDeltaGammaMax;
  ark_mem->step_setlsetupfrequency        = arkStep_SetLSetupFrequency;
  ark_mem->step_setpredictormethod        = arkStep_SetPredictorMethod;
  ark_mem->step_setmaxnonliniters         = arkStep_SetMaxNonlinIters;
  ark_mem->step_setnonlinconvcoef         = arkStep_SetNonlinConvCoef;
  ark_mem->step_setstagepredictfn         = arkStep_SetStagePredictFn;
  ark_mem->step_getnumrhsevals            = arkStep_GetNumRhsEvals;
  ark_mem->step_getnumlinsolvsetups       = arkStep_GetNumLinSolvSetups;
  ark_mem->step_getcurrentgamma           = arkStep_GetCurrentGamma;
  ark_mem->step_getestlocalerrors         = arkStep_GetEstLocalErrors;
  ark_mem->step_getnonlinearsystemdata    = arkStep_GetNonlinearSystemData;
  ark_mem->step_getnumnonlinsolviters     = arkStep_GetNumNonlinSolvIters;
  ark_mem->step_getnumnonlinsolvconvfails = arkStep_GetNumNonlinSolvConvFails;
  ark_mem->step_getnonlinsolvstats        = arkStep_GetNonlinSolvStats;
  ark_mem->step_setforcing                = arkStep_SetInnerForcing;
  ark_mem->step_supports_adaptive         = SUNTRUE;
  ark_mem->step_supports_implicit         = SUNTRUE;
  ark_mem->step_supports_massmatrix       = SUNTRUE;
  ark_mem->step_supports_relaxation       = SUNTRUE;
  ark_mem->step_mem                       = (void*)step_mem;

  /* Set default values for optional inputs */
  retval = arkStep_SetDefaults((void*)ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Set implicit/explicit problem based on function pointers */
  step_mem->explicit = (fe == NULL) ? SUNFALSE : SUNTRUE;
  step_mem->implicit = (fi == NULL) ? SUNFALSE : SUNTRUE;

  /* Allocate the general ARK stepper vectors using y0 as a template */
  /* NOTE: Fe, Fi, cvals and Xvecs will be allocated later on
     (based on the number of ARK stages) */

  /* Clone the input vector to create sdata, zpred and zcor */
  if (!arkAllocVec(ark_mem, y0, &(step_mem->sdata)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  if (!arkAllocVec(ark_mem, y0, &(step_mem->zpred)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }
  if (!arkAllocVec(ark_mem, y0, &(step_mem->zcor)))
  {
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  /* Copy the input parameters into ARKODE state */
  step_mem->fe = fe;
  step_mem->fi = fi;

  /* Update the ARKODE workspace requirements */
  ark_mem->liw += 41; /* fcn/data ptr, int, long int, sunindextype, sunbooleantype */
  ark_mem->lrw += 10;

  /* If an implicit component is to be solved, create default Newton NLS object */
  step_mem->ownNLS = SUNFALSE;
  if (step_mem->implicit)
  {
    NLS = SUNNonlinSol_Newton(y0, ark_mem->sunctx);
    if (NLS == NULL)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error creating default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    retval = ARKodeSetNonlinearSolver(ark_mem, NLS);
    if (retval != ARK_SUCCESS)
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      "Error attaching default Newton solver");
      ARKodeFree((void**)&ark_mem);
      return (NULL);
    }
    step_mem->ownNLS = SUNTRUE;
  }

  /* Set the linear solver addresses to NULL (we check != NULL later) */
  step_mem->linit       = NULL;
  step_mem->lsetup      = NULL;
  step_mem->lsolve      = NULL;
  step_mem->lfree       = NULL;
  step_mem->lmem        = NULL;
  step_mem->lsolve_type = -1;

  /* Set the mass matrix solver addresses to NULL */
  step_mem->minit       = NULL;
  step_mem->msetup      = NULL;
  step_mem->mmult       = NULL;
  step_mem->msolve      = NULL;
  step_mem->mfree       = NULL;
  step_mem->mass_mem    = NULL;
  step_mem->mass_type   = MASS_IDENTITY;
  step_mem->msolve_type = -1;

  /* Initialize initial error norm  */
  step_mem->eRNrm = ONE;

  /* Initialize all the counters */
  step_mem->nfe       = 0;
  step_mem->nfi       = 0;
  step_mem->nsetups   = 0;
  step_mem->nstlp     = 0;
  step_mem->nls_iters = 0;
  step_mem->nls_fails = 0;

  /* Initialize fused op work space */
  step_mem->cvals        = NULL;
  step_mem->Xvecs        = NULL;
  step_mem->nfusedopvecs = 0;

  /* Initialize external polynomial forcing data */
  step_mem->expforcing = SUNFALSE;
  step_mem->impforcing = SUNFALSE;
  step_mem->forcing    = NULL;
  step_mem->nforcing   = 0;

  /* Initialize saved fi alias */
  step_mem->fn_implicit = NULL;

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return (NULL);
  }

  return ((void*)ark_mem);
}